

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O1

void __thiscall
jsoncons::jsonschema::
dynamic_ref_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
do_walk(dynamic_ref_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
        *this)

{
  json_pointer *in_RCX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDX;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RSI;
  walk_reporter_type *in_R8;
  
  dynamic_ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  ::do_walk((dynamic_ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *)(this + *(long *)(*(long *)this + -0x40)),in_RSI,in_RDX,in_RCX,in_R8);
  return;
}

Assistant:

walk_result do_walk(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location, const walk_reporter_type& reporter) const final
        {
            auto rit = context.dynamic_scope().rbegin();
            auto rend = context.dynamic_scope().rend();

            const schema_validator<Json> *schema_ptr = tentative_target_;

            JSONCONS_ASSERT(schema_ptr != nullptr);

            if (value_.has_plain_name_fragment() && schema_ptr->dynamic_anchor())
            {
                while (rit != rend)
                {
                    auto p = (*rit)->get_schema_for_dynamic_anchor(schema_ptr->dynamic_anchor()->fragment()); 
                    if (p != nullptr) 
                    {
                        schema_ptr = p;
                    }
                    ++rit;
                }
            }

            eval_context<Json> this_context(context, this->keyword_name());
            return schema_ptr->walk(this_context, instance, instance_location, reporter);
        }